

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * isSimpleCount(Select *p,AggInfo *pAggInfo)

{
  Expr *pEVar1;
  Expr *pExpr;
  Table *pTab;
  AggInfo *pAggInfo_local;
  Select *p_local;
  
  if ((((p->pWhere == (Expr *)0x0) && (p->pEList->nExpr == 1)) && (p->pSrc->nSrc == 1)) &&
     (p->pSrc->a[0].pSelect == (Select *)0x0)) {
    p_local = (Select *)p->pSrc->a[0].pTab;
    pEVar1 = p->pEList->a->pExpr;
    if ((((Table *)p_local)->tabFlags & 0x10) == 0) {
      if (pEVar1->op == 0x99) {
        if (pAggInfo->nFunc == 0) {
          p_local = (Select *)0x0;
        }
        else if ((pAggInfo->aFunc->pFunc->flags & 0x10) == 0) {
          p_local = (Select *)0x0;
        }
        else if ((pEVar1->flags & 0x10) != 0) {
          p_local = (Select *)0x0;
        }
      }
      else {
        p_local = (Select *)0x0;
      }
    }
    else {
      p_local = (Select *)0x0;
    }
  }
  else {
    p_local = (Select *)0x0;
  }
  return (Table *)p_local;
}

Assistant:

static Table *isSimpleCount(Select *p, AggInfo *pAggInfo){
  Table *pTab;
  Expr *pExpr;

  assert( !p->pGroupBy );

  if( p->pWhere || p->pEList->nExpr!=1 
   || p->pSrc->nSrc!=1 || p->pSrc->a[0].pSelect
  ){
    return 0;
  }
  pTab = p->pSrc->a[0].pTab;
  pExpr = p->pEList->a[0].pExpr;
  assert( pTab && !pTab->pSelect && pExpr );

  if( IsVirtual(pTab) ) return 0;
  if( pExpr->op!=TK_AGG_FUNCTION ) return 0;
  if( NEVER(pAggInfo->nFunc==0) ) return 0;
  if( (pAggInfo->aFunc[0].pFunc->flags&SQLITE_FUNC_COUNT)==0 ) return 0;
  if( pExpr->flags&EP_Distinct ) return 0;

  return pTab;
}